

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::add_sample
          (TypedTimeSamples<tinyusdz::value::matrix4d> *this,double t,matrix4d *v)

{
  pointer *ppSVar1;
  iterator __position;
  Sample *pSVar2;
  long lVar3;
  matrix4d *pmVar4;
  Sample local_98;
  
  pSVar2 = &local_98;
  local_98.blocked = false;
  for (lVar3 = 0x10; pmVar4 = &pSVar2->value, lVar3 != 0; lVar3 = lVar3 + -1) {
    pSVar2 = (Sample *)pmVar4->m;
    pmVar4->m[0][0] = *(double *)v;
    v = (matrix4d *)((long)v + 8);
  }
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.t = t;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
                *)this,__position,&local_98);
  }
  else {
    memcpy(__position._M_current,&local_98,0x90);
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }